

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int getPixelOverflowTC(gdImagePtr im,int x,int y,int bgColor)

{
  int iVar1;
  int local_2c;
  int c;
  int bgColor_local;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  iVar1 = gdImageBoundsSafe(im,x,y);
  im_local._4_4_ = bgColor;
  if ((iVar1 != 0) && (im_local._4_4_ = im->tpixels[y][x], im_local._4_4_ == im->transparent)) {
    local_2c = bgColor;
    if (bgColor == -1) {
      local_2c = 0x7f000000;
    }
    im_local._4_4_ = local_2c;
  }
  return im_local._4_4_;
}

Assistant:

static inline int getPixelOverflowTC(gdImagePtr im, const int x, const int y, const int bgColor)
{
	if (gdImageBoundsSafe(im, x, y)) {
		const int c = im->tpixels[y][x];
		if (c == im->transparent) {
			return bgColor == -1 ? gdTrueColorAlpha(0, 0, 0, 127) : bgColor;
		}
		return c;
	} else {
		return bgColor;
	}
}